

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# p_mobj.cpp
# Opt level: O0

void __thiscall AActor::Revive(AActor *this)

{
  bool bVar1;
  int iVar2;
  TFlags<ActorFlag7,_unsigned_int> local_34;
  TFlags<ActorFlag6,_unsigned_int> local_30;
  TFlags<ActorFlag5,_unsigned_int> local_2c;
  TFlags<ActorFlag4,_unsigned_int> local_28;
  TFlags<ActorFlag3,_unsigned_int> local_24;
  TFlags<ActorFlag2,_unsigned_int> local_20;
  TFlags<ActorFlag,_unsigned_int> local_1c;
  AActor *local_18;
  AActor *info;
  AActor *this_local;
  
  info = this;
  local_18 = GetDefault(this);
  TFlags<ActorFlag,_unsigned_int>::TFlags(&local_1c,&local_18->flags);
  TFlags<ActorFlag,_unsigned_int>::operator=(&this->flags,&local_1c);
  TFlags<ActorFlag2,_unsigned_int>::TFlags(&local_20,&local_18->flags2);
  TFlags<ActorFlag2,_unsigned_int>::operator=(&this->flags2,&local_20);
  TFlags<ActorFlag3,_unsigned_int>::TFlags(&local_24,&local_18->flags3);
  TFlags<ActorFlag3,_unsigned_int>::operator=(&this->flags3,&local_24);
  TFlags<ActorFlag4,_unsigned_int>::TFlags(&local_28,&local_18->flags4);
  TFlags<ActorFlag4,_unsigned_int>::operator=(&this->flags4,&local_28);
  TFlags<ActorFlag5,_unsigned_int>::TFlags(&local_2c,&local_18->flags5);
  TFlags<ActorFlag5,_unsigned_int>::operator=(&this->flags5,&local_2c);
  TFlags<ActorFlag6,_unsigned_int>::TFlags(&local_30,&local_18->flags6);
  TFlags<ActorFlag6,_unsigned_int>::operator=(&this->flags6,&local_30);
  TFlags<ActorFlag7,_unsigned_int>::TFlags(&local_34,&local_18->flags7);
  TFlags<ActorFlag7,_unsigned_int>::operator=(&this->flags7,&local_34);
  if ((this->SpawnFlags & 0x2000) != 0) {
    TFlags<ActorFlag,_unsigned_int>::operator|=(&this->flags,MF_FRIENDLY);
  }
  FNameNoInit::operator=(&this->DamageType,&local_18->DamageType);
  iVar2 = SpawnHealth(this);
  this->health = iVar2;
  TObjPtr<AActor>::operator=(&this->target,(AActor *)0x0);
  TObjPtr<AActor>::operator=(&this->lastenemy,(AActor *)0x0);
  bVar1 = CountsAsKill(this);
  if (bVar1) {
    ::level.total_monsters = ::level.total_monsters + 1;
  }
  return;
}

Assistant:

void AActor::Revive()
{
	AActor *info = GetDefault();
	flags = info->flags;
	flags2 = info->flags2;
	flags3 = info->flags3;
	flags4 = info->flags4;
	flags5 = info->flags5;
	flags6 = info->flags6;
	flags7 = info->flags7;
	if (SpawnFlags & MTF_FRIENDLY) flags |= MF_FRIENDLY;
	DamageType = info->DamageType;
	health = SpawnHealth();
	target = NULL;
	lastenemy = NULL;

	// [RH] If it's a monster, it gets to count as another kill
	if (CountsAsKill())
	{
		level.total_monsters++;
	}
}